

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O3

void test6(void)

{
  ulong uVar1;
  Task *pTVar2;
  int (*paiVar3) [32];
  int iVar4;
  Workitem *pWVar5;
  Task *pTVar6;
  undefined8 *puVar7;
  long lVar8;
  ostream *this;
  ulong uVar9;
  int (*h) [32];
  int (*paiVar10) [32];
  arg_info *local_48;
  long local_40;
  int (*local_38) [32];
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_48 = (arg_info *)0x0;
  iVar4 = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int,int&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                    (&local_48,mx[0],mx[0]);
  if ((depspawn::internal::TP == (Task *)0x0) ||
     (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
    depspawn::internal::start_master();
  }
  pWVar5 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar5,local_48,iVar4);
  pTVar2 = depspawn::internal::TP;
  pTVar6 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                      &depspawn::internal::TP[9].next);
  *(undefined8 *)&(pTVar6->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pTVar6->func_).super__Function_base._M_functor + 8) = 0;
  (pTVar6->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (pTVar6->func_)._M_invoker = (_Invoker_type)0x0;
  puVar7 = (undefined8 *)operator_new(0x18);
  *puVar7 = depprev;
  puVar7[1] = mx;
  puVar7[2] = mx;
  *(undefined8 **)&(pTVar6->func_).super__Function_base._M_functor = puVar7;
  (pTVar6->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int,_int_&)>_>
       ::_M_invoke;
  (pTVar6->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int,_int_&)>_>
       ::_M_manager;
  pTVar6->ctx_ = pWVar5;
  pTVar6->next = pTVar2;
  depspawn::internal::Workitem::insert_in_worklist(pWVar5,pTVar6);
  if (1 < nsize) {
    lVar8 = 1;
    h = mx;
    paiVar10 = mx;
    do {
      local_48 = (arg_info *)0x0;
      local_40 = lVar8;
      local_38 = paiVar10;
      iVar4 = depspawn::internal::
              fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int,int&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                        (&local_48,*h,h[1]);
      if ((depspawn::internal::TP == (Task *)0x0) ||
         (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
        depspawn::internal::start_master();
      }
      pWVar5 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                         ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                          depspawn::internal::Workitem::Pool);
      depspawn::internal::Workitem::Workitem(pWVar5,local_48,iVar4);
      paiVar3 = local_38;
      pTVar2 = depspawn::internal::TP;
      paiVar10 = local_38 + 1;
      pTVar6 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                         ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                          &depspawn::internal::TP[9].next);
      *(undefined8 *)&(pTVar6->func_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(pTVar6->func_).super__Function_base._M_functor + 8) = 0;
      (pTVar6->func_).super__Function_base._M_manager = (_Manager_type)0x0;
      (pTVar6->func_)._M_invoker = (_Invoker_type)0x0;
      puVar7 = (undefined8 *)operator_new(0x18);
      *puVar7 = depprev;
      puVar7[1] = paiVar10;
      puVar7[2] = paiVar3;
      *(undefined8 **)&(pTVar6->func_).super__Function_base._M_functor = puVar7;
      (pTVar6->func_)._M_invoker =
           std::
           _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int,_int_&)>_>
           ::_M_invoke;
      (pTVar6->func_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int,_int_&)>_>
           ::_M_manager;
      pTVar6->ctx_ = pWVar5;
      pTVar6->next = pTVar2;
      depspawn::internal::Workitem::insert_in_worklist(pWVar5,pTVar6);
      lVar8 = local_40 + 1;
      h = h + 1;
    } while (lVar8 < nsize);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar10 = mx;
  if (0 < nsize) {
    uVar9 = 0;
    iVar4 = nsize;
    do {
      uVar1 = uVar9 + 1;
      if (uVar1 != (uint)(*paiVar10)[0]) {
        this = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(this," -> ",4);
        std::ostream::operator<<(this,(*paiVar10)[0]);
        retstate = -1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error\n",6);
        iVar4 = nsize;
      }
      (*paiVar10)[0] = 0;
      paiVar10 = paiVar10 + 1;
      uVar9 = uVar1;
    } while ((long)uVar1 < (long)iVar4);
  }
  pr("f(int, int&) dep->");
  return;
}

Assistant:

void test6() 
{
  
  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(depprev, mx[0][0], mx[0][0]);
  
  for(int i = 1; i < nsize; i++) {
    spawn(depprev, mx[i-1][0], mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (i+1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(int, int&) dep->");
  
}